

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.h
# Opt level: O2

void __thiscall VCWinDeployQtTool::~VCWinDeployQtTool(VCWinDeployQtTool *this)

{
  ~VCWinDeployQtTool(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

VCWinDeployQtTool() {}